

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O2

void __thiscall amrex::MLMG::computeResOfCorrection(MLMG *this,int amrlev,int mglev)

{
  long lVar1;
  long lVar2;
  
  lVar2 = (long)amrlev;
  lVar1 = (long)mglev * 8;
  (*this->linop->_vptr_MLLinOp[0x35])
            (this->linop,lVar2,(long)mglev,
             lVar1 + *(long *)&(this->rescor).
                               super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                               .
                               super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar2].
                               super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                               super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>,
             *(long *)&(this->cor).
                       super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                       .
                       super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar2].
                       super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                       super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar1,
             *(long *)&(this->res).
                       super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                       .
                       super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar2].
                       super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                       super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar1,0,0);
  return;
}

Assistant:

void
MLMG::computeResOfCorrection (int amrlev, int mglev)
{
    BL_PROFILE("MLMG:computeResOfCorrection()");
    Any      & x =    cor[amrlev][mglev];
    const Any& b =    res[amrlev][mglev];
    Any      & r = rescor[amrlev][mglev];
    linop.AnyCorrectionResidual(amrlev, mglev, r, x, b, BCMode::Homogeneous);
}